

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Endpoint.cpp
# Opt level: O1

void __thiscall Liby::Endpoint::Endpoint(Endpoint *this,string *addr,uint16_t port)

{
  int iVar1;
  undefined8 *puVar2;
  char *pcVar3;
  
  iVar1 = inet_pton(2,(addr->_M_dataplus)._M_p,&this->addr_);
  if (iVar1 == 0) {
    puVar2 = (undefined8 *)__cxa_allocate_exception(8);
    pcVar3 = anon_var_dwarf_7d59f;
  }
  else if (iVar1 < -1) {
    puVar2 = (undefined8 *)__cxa_allocate_exception(8);
    pcVar3 = anon_var_dwarf_7d5b5;
  }
  else {
    if (iVar1 == 1) {
      this->port_ = port << 8 | port >> 8;
      return;
    }
    puVar2 = (undefined8 *)__cxa_allocate_exception(8);
    pcVar3 = anon_var_dwarf_7d5bf;
  }
  *puVar2 = pcVar3;
  __cxa_throw(puVar2,&char_const*::typeinfo,0);
}

Assistant:

Endpoint::Endpoint(const std::string &addr, uint16_t port) {
    int ret = ::inet_pton(AF_INET, addr.data(), &addr_);

    if (ret == 0) {
        throw "无效协议";
    } else if (ret < -1) {
        throw "遇到错误";
    } else if (ret != 1) {
        throw "未知错误";
    }

    port_ = htons(port);
}